

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsslsocket.cpp
# Opt level: O0

void __thiscall QSslSocket::setPeerVerifyDepth(QSslSocket *this,int depth)

{
  bool bVar1;
  QSslSocketPrivate *this_00;
  uint in_ESI;
  QMessageLogger *in_RDI;
  long in_FS_OFFSET;
  QSslSocketPrivate *d;
  QLoggingCategoryMacroHolder<(QtMsgType)1> qt_category;
  QLoggingCategory *in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffb8;
  char local_38 [32];
  undefined8 local_18;
  ulong local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = d_func((QSslSocket *)0x3a1739);
  if ((int)in_ESI < 0) {
    local_18 = 0xaaaaaaaaaaaaaaaa;
    local_10 = 0xaaaaaaaaaaaaaaaa;
    QtPrivateLogging::lcSsl();
    anon_unknown.dwarf_a87c06::QLoggingCategoryMacroHolder<(QtMsgType)1>::
    QLoggingCategoryMacroHolder
              ((QLoggingCategoryMacroHolder<(QtMsgType)1> *)this_00,in_stack_ffffffffffffffa8);
    while (bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                             ((QLoggingCategoryMacroHolder *)&local_18), bVar1) {
      anon_unknown.dwarf_a87c06::QLoggingCategoryMacroHolder<(QtMsgType)1>::name
                ((QLoggingCategoryMacroHolder<(QtMsgType)1> *)0x3a1789);
      QMessageLogger::QMessageLogger
                (in_RDI,(char *)CONCAT44(in_ESI,in_stack_ffffffffffffffb8),
                 (int)((ulong)this_00 >> 0x20),(char *)in_stack_ffffffffffffffa8,(char *)0x3a179f);
      QMessageLogger::warning
                (local_38,"QSslSocket::setPeerVerifyDepth: cannot set negative depth of %d",
                 (ulong)in_ESI);
      local_10 = local_10 & 0xffffffffffffff00;
    }
  }
  else {
    (this_00->configuration).peerVerifyDepth = in_ESI;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QSslSocket::setPeerVerifyDepth(int depth)
{
    Q_D(QSslSocket);
    if (depth < 0) {
        qCWarning(lcSsl, "QSslSocket::setPeerVerifyDepth: cannot set negative depth of %d", depth);
        return;
    }
    d->configuration.peerVerifyDepth = depth;
}